

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::perturbMinLeave(SPxSolverBase<double> *this)

{
  UpdateVector<double> *pUVar1;
  VectorBase<double> *pVVar2;
  VectorBase<double> *pVVar3;
  Real RVar4;
  double dVar5;
  
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
  SSVectorBase<double>::setup(&this->thePvec->thedelta);
  SSVectorBase<double>::setup(&this->theCoPvec->thedelta);
  pUVar1 = this->thePvec;
  pVVar2 = this->theLbound;
  pVVar3 = this->theUbound;
  RVar4 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  dVar5 = leavetol(this);
  dVar5 = perturbMin(this,pUVar1,pVVar2,pVVar3,RVar4,dVar5,
                     ((this->super_SPxBasisBase<double>).thedesc.stat)->data,0,1);
  this->theShift = dVar5 + this->theShift;
  pUVar1 = this->theCoPvec;
  pVVar2 = this->theCoLbound;
  pVVar3 = this->theCoUbound;
  RVar4 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  dVar5 = leavetol(this);
  dVar5 = perturbMin(this,pUVar1,pVVar2,pVVar3,RVar4,dVar5,
                     ((this->super_SPxBasisBase<double>).thedesc.costat)->data,0,1);
  this->theShift = dVar5 + this->theShift;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMinLeave(void)
{
   SPxOut::debug(this, "DSHIFT05 iteration= {} perturbing {}", this->iteration(), shift());
   pVec().delta().setup();
   coPvec().delta().setup();
   theShift += perturbMin(pVec(), lpBound(), upBound(), epsilon(), leavetol(),
                          this->desc().status(), 0, 1);
   theShift += perturbMin(coPvec(), lcBound(), ucBound(), epsilon(), leavetol(),
                          this->desc().coStatus(), 0, 1);
   SPxOut::debug(this, "\t->{}\n", shift());
}